

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cpp
# Opt level: O3

void __thiscall ANN::~ANN(ANN *this)

{
  annDeallocPts(&this->data_pts);
  annDeallocPt(&this->query_pt);
  if (this->node_indices != (int *)0x0) {
    operator_delete__(this->node_indices);
  }
  operator_delete(this->nn_idx);
  operator_delete(this->dists);
  if (this->the_tree != (ANNkd_tree *)0x0) {
    (*(this->the_tree->super_ANNpointSet)._vptr_ANNpointSet[1])();
    return;
  }
  return;
}

Assistant:

ANN::~ANN() {
    annDeallocPts(data_pts);  // deallocate data points
    annDeallocPt(query_pt);   // deallocate query points
    delete[] node_indices;    // deallocate point indices
    delete (nn_idx);          // deallocate the near neighbors indices
    delete (dists);           // deallocate the near neighbors distances
    delete (the_tree);        // deastroy the ANN tree
}